

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_options.h
# Opt level: O2

void __thiscall google::protobuf::compiler::cpp::Options::~Options(Options *this)

{
  std::__cxx11::string::~string((string *)&this->annotation_guard_name);
  std::__cxx11::string::~string((string *)&this->annotation_pragma_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Options()
      : safe_boundary_check(false),
        proto_h(false),
        transitive_pb_h(true),
        annotate_headers(false),
        enforce_lite(false),
        table_driven_parsing(false) {}